

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

void dumpFilename(Symbol *sym)

{
  uint uVar1;
  char *__s;
  
  uVar1 = sym->fileLine;
  if (sym->src == (FileStackNode *)0x0) {
    if (uVar1 == 0) {
      __s = "<command-line>";
    }
    else {
      __s = "<builtin>";
    }
    fputs(__s,_stderr);
    return;
  }
  dumpNodeAndParents(sym->src);
  fprintf(_stderr,"(%u)",(ulong)uVar1);
  return;
}

Assistant:

static void dumpFilename(struct Symbol const *sym)
{
	if (sym->src)
		fstk_Dump(sym->src, sym->fileLine);
	else if (sym->fileLine == 0)
		fputs("<command-line>", stderr);
	else
		fputs("<builtin>", stderr);
}